

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::ParseAudioSource
               (AudioSource *source,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 uVar3;
  bool bVar4;
  undefined1 extraout_AL;
  reference pbVar5;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *o_00;
  json_const_iterator it;
  string local_78;
  string local_50;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
  paVar2 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ParseStringProperty(&source->name,err,o,&local_78,false,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"uri","");
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar2;
  ParseStringProperty(&source->uri,err,o,&local_78,false,&local_50);
  o_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
    o_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
    o_00 = extraout_RDX_01;
  }
  if ((source->uri)._M_string_length == 0) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bufferView","");
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    ParseIntegerProperty(&source->bufferView,err,o,&local_78,true,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mimeType","");
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar2;
    ParseStringProperty(&source->mimeType,err,o,&local_78,true,&local_50);
    o_00 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
      o_00 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
      o_00 = extraout_RDX_04;
    }
  }
  ParseExtensionsProperty(&source->extensions,(string *)o,o_00);
  uVar3 = ParseExtrasProperty(&source->extras,o);
  if (store_original_json_for_extras_and_extensions) {
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 0x8000000000000000;
    bVar4 = detail::FindMember(o,"extensions",(json_const_iterator *)&local_78);
    if (bVar4) {
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump(&local_50,pbVar5,-1,' ',false,strict);
      std::__cxx11::string::operator=((string *)&source->extensions_json_string,(string *)&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = 0x8000000000000000;
    uVar3 = detail::FindMember(o,"extras",(json_const_iterator *)&local_78);
    if ((bool)uVar3) {
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump(&local_50,pbVar5,-1,' ',false,strict);
      uVar3 = std::__cxx11::string::operator=
                        ((string *)&source->extras_json_string,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p);
        uVar3 = extraout_AL;
      }
    }
  }
  return (bool)uVar3;
}

Assistant:

static bool ParseAudioSource(
    AudioSource *source, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  ParseStringProperty(&source->name, err, o, "name", false);
  ParseStringProperty(&source->uri, err, o, "uri", false);

  if (source->uri.empty()) {
    ParseIntegerProperty(&source->bufferView, err, o, "bufferView", true);
    ParseStringProperty(&source->mimeType, err, o, "mimeType", true);
  }

  ParseExtrasAndExtensions(source, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}